

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O0

void aom_highbd_comp_mask_pred_c
               (uint8_t *comp_pred8,uint8_t *pred8,int width,int height,uint8_t *ref8,int ref_stride
               ,uint8_t *mask,int mask_stride,int invert_mask)

{
  uint16_t *comp_pred;
  uint16_t *ref;
  uint16_t *pred;
  int j;
  int i;
  int ref_stride_local;
  uint8_t *ref8_local;
  int height_local;
  int width_local;
  uint8_t *pred8_local;
  uint8_t *comp_pred8_local;
  
  pred = (uint16_t *)((long)pred8 << 1);
  ref = (uint16_t *)((long)ref8 << 1);
  comp_pred = (uint16_t *)((long)comp_pred8 << 1);
  for (i = 0; i < height; i = i + 1) {
    for (j = 0; j < width; j = j + 1) {
      if (invert_mask == 0) {
        comp_pred[j] = (uint16_t)
                       ((int)((uint)mask[j] * (uint)ref[j] + (0x40 - (uint)mask[j]) * (uint)pred[j]
                             + 0x20) >> 6);
      }
      else {
        comp_pred[j] = (uint16_t)
                       ((int)((uint)mask[j] * (uint)pred[j] + (0x40 - (uint)mask[j]) * (uint)ref[j]
                             + 0x20) >> 6);
      }
    }
    comp_pred = comp_pred + width;
    pred = pred + width;
    ref = ref + ref_stride;
    mask = mask + mask_stride;
  }
  return;
}

Assistant:

void aom_highbd_comp_mask_pred_c(uint8_t *comp_pred8, const uint8_t *pred8,
                                 int width, int height, const uint8_t *ref8,
                                 int ref_stride, const uint8_t *mask,
                                 int mask_stride, int invert_mask) {
  int i, j;
  uint16_t *pred = CONVERT_TO_SHORTPTR(pred8);
  uint16_t *ref = CONVERT_TO_SHORTPTR(ref8);
  uint16_t *comp_pred = CONVERT_TO_SHORTPTR(comp_pred8);
  for (i = 0; i < height; ++i) {
    for (j = 0; j < width; ++j) {
      if (!invert_mask)
        comp_pred[j] = AOM_BLEND_A64(mask[j], ref[j], pred[j]);
      else
        comp_pred[j] = AOM_BLEND_A64(mask[j], pred[j], ref[j]);
    }
    comp_pred += width;
    pred += width;
    ref += ref_stride;
    mask += mask_stride;
  }
}